

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall despot::Parser::ParseHasTerminalTag(Parser *this,TiXmlHandle *xml_handle)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s;
  ctype *pcVar4;
  log_ostream *plVar5;
  ostream *poVar6;
  ulong uVar7;
  allocator<char> local_71;
  TiXmlHandle local_70;
  TiXmlHandle local_68;
  ulong local_60;
  _func_int **local_58;
  long *local_48;
  TiXmlNode *local_40;
  long local_38 [2];
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_70,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_68,(char *)&local_70);
  if (local_68.node != (TiXmlNode *)0x0) {
    iVar3 = (*((local_68.node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      iVar3 = (*((local_68.node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
      if ((TiXmlElement *)CONCAT44(extraout_var_00,iVar3) != (TiXmlElement *)0x0) {
        __s = util::tinyxml::TiXmlElement::GetText((TiXmlElement *)CONCAT44(extraout_var_00,iVar3));
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_71);
        std::locale::locale((locale *)&local_70);
        local_68.node = (TiXmlNode *)&local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_48,
                   (long)&(local_40->super_TiXmlBase)._vptr_TiXmlBase + (long)local_48);
        if (local_60 != 0) {
          uVar7 = 0;
          do {
            cVar1 = *(char *)((long)&((local_68.node)->super_TiXmlBase)._vptr_TiXmlBase + uVar7);
            pcVar4 = std::use_facet<std::ctype<char>>((locale *)&local_70);
            uVar2 = (**(code **)(*(long *)pcVar4 + 0x20))(pcVar4,(int)cVar1);
            *(undefined1 *)((long)&((local_68.node)->super_TiXmlBase)._vptr_TiXmlBase + uVar7) =
                 uVar2;
            uVar7 = uVar7 + 1;
          } while (uVar7 < local_60);
        }
        std::locale::~locale((locale *)&local_70);
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        this->has_terminal_ = iVar3 == 0;
        if (local_68.node != (TiXmlNode *)&local_58) {
          operator_delete(local_68.node,(long)local_58 + 1);
        }
        if (local_48 != local_38) {
          operator_delete(local_48,local_38[0] + 1);
        }
        goto LAB_0014bd58;
      }
    }
  }
  this->has_terminal_ = true;
LAB_0014bd58:
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"HasTerminal = ",0xe);
      poVar6 = std::ostream::_M_insert<bool>(SUB81(plVar5,0));
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void Parser::ParseHasTerminalTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_HasTerminal = xml_handle.FirstChild("pomdpx").FirstChild(
		"HasTerminal").ToElement();
	if (e_HasTerminal != NULL) {
		has_terminal_ = (lower(e_HasTerminal->GetText()) == "true");
	} else {
		has_terminal_ = true;
	}
	logi << "HasTerminal = " << has_terminal_ << endl;
}